

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.cpp
# Opt level: O3

string * __thiscall
pbrt::TabulatedBSSRDF::ToString_abi_cxx11_(string *__return_storage_ptr__,TabulatedBSSRDF *this)

{
  BSSRDFTable *args_4;
  
  args_4 = this->table;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::Point3<float>const&,float_const&,pbrt::Normal3<float>const&,pbrt::SampledSpectrum_const&,pbrt::SampledSpectrum_const&,pbrt::BSSRDFTable_const&>
            (__return_storage_ptr__,
             "[ TabulatedBSSRDF po: %s eta: %f ns: %s sigma_t: %s rho: %s table: %s ]",&this->po,
             &this->eta,&this->ns,&this->sigma_t,&this->rho,args_4);
  return __return_storage_ptr__;
}

Assistant:

std::string TabulatedBSSRDF::ToString() const {
    return StringPrintf(
        "[ TabulatedBSSRDF po: %s eta: %f ns: %s sigma_t: %s rho: %s table: %s ]", po,
        eta, ns, sigma_t, rho, *table);
}